

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint readChunk_iTXt(LodePNGInfo *info,LodePNGDecompressSettings *zlibsettings,uchar *data,
                   size_t chunkLength)

{
  bool bVar1;
  uint local_70;
  size_t local_68;
  size_t size;
  uchar *str;
  char *transkey;
  char *langtag;
  char *key;
  uint local_38;
  uint compressed;
  uint begin;
  uint length;
  uint i;
  uint error;
  size_t chunkLength_local;
  uchar *data_local;
  LodePNGDecompressSettings *zlibsettings_local;
  LodePNGInfo *info_local;
  
  length = 0;
  langtag = (char *)0x0;
  transkey = (char *)0x0;
  str = (uchar *)0x0;
  _i = chunkLength;
  chunkLength_local = (size_t)data;
  data_local = (uchar *)zlibsettings;
  zlibsettings_local = (LodePNGDecompressSettings *)info;
  if (chunkLength < 5) {
    length = 0x1e;
  }
  else {
    compressed = 0;
    while( true ) {
      bVar1 = false;
      if (compressed < chunkLength) {
        bVar1 = data[compressed] != '\0';
      }
      if (!bVar1) break;
      compressed = compressed + 1;
    }
    if (compressed + 3 < chunkLength) {
      if ((compressed == 0) || (0x4f < compressed)) {
        length = 0x59;
      }
      else {
        langtag = (char *)lodepng_malloc((ulong)(compressed + 1));
        if (langtag == (char *)0x0) {
          length = 0x53;
        }
        else {
          lodepng_memcpy(langtag,(void *)chunkLength_local,(ulong)compressed);
          langtag[compressed] = '\0';
          key._4_4_ = (uint)*(byte *)(chunkLength_local + (compressed + 1));
          if (*(char *)(chunkLength_local + (compressed + 2)) == '\0') {
            local_38 = compressed + 3;
            compressed = 0;
            begin = local_38;
            while( true ) {
              bVar1 = false;
              if (begin < _i) {
                bVar1 = *(char *)(chunkLength_local + begin) != '\0';
              }
              if (!bVar1) break;
              compressed = compressed + 1;
              begin = begin + 1;
            }
            transkey = (char *)lodepng_malloc((ulong)(compressed + 1));
            if (transkey == (char *)0x0) {
              length = 0x53;
            }
            else {
              lodepng_memcpy(transkey,(void *)(chunkLength_local + local_38),(ulong)compressed);
              transkey[compressed] = '\0';
              local_38 = compressed + 1 + local_38;
              compressed = 0;
              begin = local_38;
              while( true ) {
                bVar1 = false;
                if (begin < _i) {
                  bVar1 = *(char *)(chunkLength_local + begin) != '\0';
                }
                if (!bVar1) break;
                compressed = compressed + 1;
                begin = begin + 1;
              }
              str = (uchar *)lodepng_malloc((ulong)(compressed + 1));
              if (str == (uchar *)0x0) {
                length = 0x53;
              }
              else {
                lodepng_memcpy(str,(void *)(chunkLength_local + local_38),(ulong)compressed);
                str[compressed] = '\0';
                local_38 = compressed + 1 + local_38;
                if ((uint)_i < local_38) {
                  local_70 = 0;
                }
                else {
                  local_70 = (uint)_i - local_38;
                }
                compressed = local_70;
                if (key._4_4_ == 0) {
                  length = lodepng_add_itext_sized
                                     ((LodePNGInfo *)zlibsettings_local,langtag,transkey,(char *)str
                                      ,(char *)(chunkLength_local + local_38),(ulong)local_70);
                }
                else {
                  size = 0;
                  local_68 = 0;
                  length = zlib_decompress((uchar **)&size,&local_68,0,
                                           (uchar *)(chunkLength_local + local_38),(ulong)local_70,
                                           (LodePNGDecompressSettings *)data_local);
                  if (length == 0) {
                    length = lodepng_add_itext_sized
                                       ((LodePNGInfo *)zlibsettings_local,langtag,transkey,
                                        (char *)str,(char *)size,local_68);
                  }
                  lodepng_free((void *)size);
                }
              }
            }
          }
          else {
            length = 0x48;
          }
        }
      }
    }
    else {
      length = 0x4b;
    }
  }
  lodepng_free(langtag);
  lodepng_free(transkey);
  lodepng_free(str);
  return length;
}

Assistant:

static unsigned readChunk_iTXt(LodePNGInfo* info, const LodePNGDecompressSettings* zlibsettings,
                               const unsigned char* data, size_t chunkLength) {
  unsigned error = 0;
  unsigned i;

  unsigned length, begin, compressed;
  char *key = 0, *langtag = 0, *transkey = 0;

  while(!error) /*not really a while loop, only used to break on error*/ {
    /*Quick check if the chunk length isn't too small. Even without check
    it'd still fail with other error checks below if it's too short. This just gives a different error code.*/
    if(chunkLength < 5) CERROR_BREAK(error, 30); /*iTXt chunk too short*/

    /*read the key*/
    for(length = 0; length < chunkLength && data[length] != 0; ++length) ;
    if(length + 3 >= chunkLength) CERROR_BREAK(error, 75); /*no null termination char, corrupt?*/
    if(length < 1 || length > 79) CERROR_BREAK(error, 89); /*keyword too short or long*/

    key = (char*)lodepng_malloc(length + 1);
    if(!key) CERROR_BREAK(error, 83); /*alloc fail*/

    lodepng_memcpy(key, data, length);
    key[length] = 0;

    /*read the compression method*/
    compressed = data[length + 1];
    if(data[length + 2] != 0) CERROR_BREAK(error, 72); /*the 0 byte indicating compression must be 0*/

    /*even though it's not allowed by the standard, no error is thrown if
    there's no null termination char, if the text is empty for the next 3 texts*/

    /*read the langtag*/
    begin = length + 3;
    length = 0;
    for(i = begin; i < chunkLength && data[i] != 0; ++i) ++length;

    langtag = (char*)lodepng_malloc(length + 1);
    if(!langtag) CERROR_BREAK(error, 83); /*alloc fail*/

    lodepng_memcpy(langtag, data + begin, length);
    langtag[length] = 0;

    /*read the transkey*/
    begin += length + 1;
    length = 0;
    for(i = begin; i < chunkLength && data[i] != 0; ++i) ++length;

    transkey = (char*)lodepng_malloc(length + 1);
    if(!transkey) CERROR_BREAK(error, 83); /*alloc fail*/

    lodepng_memcpy(transkey, data + begin, length);
    transkey[length] = 0;

    /*read the actual text*/
    begin += length + 1;

    length = (unsigned)chunkLength < begin ? 0 : (unsigned)chunkLength - begin;

    if(compressed) {
      unsigned char* str = 0;
      size_t size = 0;
      /*will fail if zlib error, e.g. if length is too small*/
      error = zlib_decompress(&str, &size, 0, &data[begin],
                              length, zlibsettings);
      if(!error) error = lodepng_add_itext_sized(info, key, langtag, transkey, (char*)str, size);
      lodepng_free(str);
    } else {
      error = lodepng_add_itext_sized(info, key, langtag, transkey, (char*)(data + begin), length);
    }

    break;
  }

  lodepng_free(key);
  lodepng_free(langtag);
  lodepng_free(transkey);

  return error;
}